

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

Output_Port * __thiscall
Output_Port::Search(Output_Port *this,Am_Object_Advanced *object,Am_Slot_Key key)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  bool bVar3;
  Am_Object local_38;
  Output_Port *local_30;
  Output_Port *curr;
  Am_Object *pAStack_20;
  Am_Slot_Key key_local;
  Am_Object_Advanced *object_local;
  Output_Port *this_local;
  
  local_30 = this;
  curr._6_2_ = key;
  pAStack_20 = &object->super_Am_Object;
  object_local = (Am_Object_Advanced *)this;
  while( true ) {
    if (local_30 == (Output_Port *)0x0) {
      return (Output_Port *)0x0;
    }
    Am_Slot::Get_Owner((Am_Slot *)&local_38);
    bVar1 = Am_Object::operator==(&local_38,pAStack_20);
    bVar3 = false;
    if (bVar1) {
      AVar2 = Am_Slot::Get_Key(&local_30->context);
      bVar3 = AVar2 == curr._6_2_;
    }
    Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_38);
    if (bVar3) break;
    local_30 = local_30->next;
  }
  return local_30;
}

Assistant:

Output_Port *Search(const Am_Object_Advanced &object, Am_Slot_Key key)
  {
    Output_Port *curr;
    for (curr = this; curr; curr = curr->next)
      if ((curr->context.Get_Owner() == object) &&
          (curr->context.Get_Key() == key))
        return curr;
    return nullptr;
  }